

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateDotLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  LogMessage *pLVar6;
  iterator iVar7;
  Type *pTVar8;
  mapped_type *pmVar9;
  long *plVar10;
  _Rb_tree_header *p_Var11;
  long *plVar12;
  Result r;
  string err;
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_150;
  NeuralNetworkSpecValidator *local_148;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 local_a8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_148 = this;
  Result::Result((Result *)local_178);
  validateInputCount((Result *)local_140,layer,2,2);
  local_178 = local_140;
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != local_128) {
    operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_178);
  if (bVar5) {
    validateOutputCount((Result *)local_140,layer,1,1);
    local_178 = local_140;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
  }
  bVar5 = Result::good((Result *)local_178);
  if ((bVar5) && (local_148->ndArrayInterpretation == true)) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"DotProduct","");
    local_150 = &local_148->blobNameToRank;
    validateInputOutputRankEquality((Result *)local_140,layer,&local_c8,local_150);
    local_178 = local_140;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)local_178);
    if (bVar5) {
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"DotProduct","");
      validateRankCount((Result *)local_140,layer,(string *)local_a8,3,-1,local_150);
      local_178 = local_140;
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_p != local_128) {
        operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      bVar5 = Result::good((Result *)local_178);
      if (bVar5) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_140,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_150->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var11 = &(local_148->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node != p_Var11) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_140,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar6 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_140,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar6);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_140);
          }
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&local_150->_M_t,
                         *(key_type **)((layer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
          if ((_Rb_tree_header *)iVar7._M_node != p_Var11) {
            pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&(layer->input_).super_RepeatedPtrFieldBase,0);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(local_150,pTVar8);
            iVar2 = *pmVar9;
            pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&(layer->input_).super_RepeatedPtrFieldBase,1);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(local_150,pTVar8);
            if (iVar2 != *pmVar9) {
              local_108._M_string_length = 0;
              local_108.field_2._M_local_buf[0] = '\0';
              psVar3 = (layer->name_).ptr_;
              pcVar4 = (psVar3->_M_dataplus)._M_p;
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar4,pcVar4 + psVar3->_M_string_length);
              std::operator+(&local_70,"Layer \'",&local_e8);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
              plVar12 = plVar10 + 2;
              if ((long *)*plVar10 == plVar12) {
                local_40 = *plVar12;
                lStack_38 = plVar10[3];
                local_50 = &local_40;
              }
              else {
                local_40 = *plVar12;
                local_50 = (long *)*plVar10;
              }
              local_48 = plVar10[1];
              *plVar10 = (long)plVar12;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
              if (local_50 != &local_40) {
                operator_delete(local_50,local_40 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                         local_108.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_002d9048;
            }
          }
        }
      }
    }
  }
  __return_storage_ptr__->m_type = local_178._0_4_;
  __return_storage_ptr__->m_reason = local_178._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p == &local_160) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_160._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_170._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_168;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_170._M_p = (pointer)&local_160;
LAB_002d9048:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateDotLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // 2 inputs, 1 output
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "DotProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "DotProduct", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'DotProduct' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}